

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::apply_and_log_current_params(raft_server *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  element_type *peVar8;
  long in_RDI;
  ptr<raft_params> params;
  int32 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  int32 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  char *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [72];
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d4ed5);
  context::get_params((context *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  bVar4 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (!bVar4) {
    peVar7 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d4f0e);
    iVar5 = peVar7->heart_beat_interval_;
    peVar7 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d4f25);
    if (peVar7->election_timeout_lower_bound_ <= iVar5) {
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d4f45);
      iVar5 = peVar7->heart_beat_interval_;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d4f5e);
      peVar7->election_timeout_lower_bound_ = iVar5 << 1;
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d4f99);
        iVar5 = (*peVar8->_vptr_logger[7])();
        if (2 < iVar5) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d4fd2);
          peVar7 = std::
                   __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1d4fe7);
          msg_if_given_abi_cxx11_
                    ((char *)local_78,
                     "invalid election timeout lower bound detected, adjusted to %d",
                     (ulong)(uint)peVar7->election_timeout_lower_bound_);
          (*peVar8->_vptr_logger[8])
                    (peVar8,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"apply_and_log_current_params",0x175,local_78);
          std::__cxx11::string::~string(local_78);
        }
      }
    }
    peVar7 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d5093);
    iVar5 = peVar7->election_timeout_lower_bound_;
    peVar7 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d50aa);
    if (peVar7->election_timeout_upper_bound_ <= iVar5) {
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d50c9);
      iVar5 = peVar7->election_timeout_lower_bound_;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d50e2);
      peVar7->election_timeout_upper_bound_ = iVar5 << 1;
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d511c);
        iVar5 = (*peVar8->_vptr_logger[7])();
        if (2 < iVar5) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d5155);
          peVar7 = std::
                   __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1d516a);
          msg_if_given_abi_cxx11_
                    ((char *)local_98,
                     "invalid election timeout upper bound detected, adjusted to %d",
                     (ulong)(uint)peVar7->election_timeout_upper_bound_);
          (*peVar8->_vptr_logger[8])
                    (peVar8,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"apply_and_log_current_params",0x17c,local_98);
          std::__cxx11::string::~string(local_98);
        }
      }
    }
  }
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar4) {
    peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d5222);
    iVar5 = (*peVar8->_vptr_logger[7])();
    if (3 < iVar5) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d525b);
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d5278);
      uVar1 = peVar7->election_timeout_lower_bound_;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d528f);
      uVar2 = peVar7->election_timeout_upper_bound_;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d52a5);
      uVar3 = peVar7->heart_beat_interval_;
      uVar6 = get_leadership_expiry((raft_server *)in_stack_fffffffffffffe00);
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d52d2);
      in_stack_fffffffffffffde8 = peVar7->max_append_size_;
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d52e9);
      in_stack_fffffffffffffdf0 = peVar7->rpc_failure_backoff_;
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d5300);
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d5317);
      in_stack_fffffffffffffe00 = "NO";
      if ((peVar7->enable_randomized_snapshot_creation_ & 1U) != 0) {
        in_stack_fffffffffffffe00 = "YES";
      }
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d5344);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d535b);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d5372);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d5389);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d53b6);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d53e3);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d53fa);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d5411);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d548c);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d54a3);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d54ba);
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d54e7);
      msg_if_given_abi_cxx11_
                ((char *)local_b8,
                 "parameters: timeout %d - %d, heartbeat %d, leadership expiry %d, max batch %d, backoff %d, snapshot distance %d, enable randomized snapshot creation %s, log sync stop gap %d, reserved logs %d, client timeout %d, auto forwarding %s, API call type %s, custom commit quorum size %d, custom election quorum size %d, snapshot receiver %s, leadership transfer wait time %d, grace period of lagging state machine %d, snapshot IO: %s, parallel log appending: %s"
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar6);
      (*peVar8->_vptr_logger[8])
                (peVar8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"apply_and_log_current_params",0x1a3,local_b8);
      std::__cxx11::string::~string(local_b8);
    }
  }
  std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d5649);
  timer_helper::set_duration_ms
            ((timer_helper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  timer_helper::reset((timer_helper *)in_stack_fffffffffffffe00);
  std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d5695);
  timer_helper::set_duration_ms
            ((timer_helper *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1d56b5);
  return;
}

Assistant:

void raft_server::apply_and_log_current_params() {
    ptr<raft_params> params = ctx_->get_params();

    if (!test_mode_flag_) {
        if (params->heart_beat_interval_ >= params->election_timeout_lower_bound_) {
            params->election_timeout_lower_bound_ = params->heart_beat_interval_ * 2;
            p_wn("invalid election timeout lower bound detected, adjusted to %d",
                 params->election_timeout_lower_bound_);
        }
        if (params->election_timeout_lower_bound_
            >= params->election_timeout_upper_bound_) {
            params->election_timeout_upper_bound_ =
                params->election_timeout_lower_bound_ * 2;
            p_wn("invalid election timeout upper bound detected, adjusted to %d",
                 params->election_timeout_upper_bound_);
        }
    }

    p_in( "parameters: "
          "timeout %d - %d, heartbeat %d, "
          "leadership expiry %d, "
          "max batch %d, backoff %d, snapshot distance %d, "
          "enable randomized snapshot creation %s, "
          "log sync stop gap %d, "
          "reserved logs %d, client timeout %d, "
          "auto forwarding %s, API call type %s, "
          "custom commit quorum size %d, "
          "custom election quorum size %d, "
          "snapshot receiver %s, "
          "leadership transfer wait time %d, "
          "grace period of lagging state machine %d, "
          "snapshot IO: %s, "
          "parallel log appending: %s",
          params->election_timeout_lower_bound_,
          params->election_timeout_upper_bound_,
          params->heart_beat_interval_,
          get_leadership_expiry(),
          params->max_append_size_,
          params->rpc_failure_backoff_,
          params->snapshot_distance_,
          params->enable_randomized_snapshot_creation_ ? "YES" : "NO",
          params->log_sync_stop_gap_,
          params->reserved_log_items_,
          params->client_req_timeout_,
          ( params->auto_forwarding_ ? "ON" : "OFF" ),
          ( params->return_method_ == raft_params::blocking
            ? "BLOCKING" : "ASYNC" ),
          params->custom_commit_quorum_size_,
          params->custom_election_quorum_size_,
          params->exclude_snp_receiver_from_quorum_ ? "EXCLUDED" : "INCLUDED",
          params->leadership_transfer_min_wait_time_,
          params->grace_period_of_lagging_state_machine_,
          params->use_bg_thread_for_snapshot_io_ ? "ASYNC" : "BLOCKING",
          params->parallel_log_appending_ ? "ON" : "OFF" );

    status_check_timer_.set_duration_ms(params->heart_beat_interval_);
    status_check_timer_.reset();

    leadership_transfer_timer_.set_duration_ms
        (params->leadership_transfer_min_wait_time_);
}